

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

bool __thiscall
BamTools::BamAlignment::SkipToNextTag
          (BamAlignment *this,char storageType,char **pTagData,uint *numBytesParsed)

{
  int *in_RCX;
  long *in_RDX;
  undefined1 in_SIL;
  string message;
  string message_1;
  int bytesToSkip;
  int32_t numElements;
  char arrayType;
  undefined8 in_stack_fffffffffffffea0;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_121;
  string local_120 [32];
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  BamAlignment *in_stack_ffffffffffffff10;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  string local_58 [36];
  int local_34;
  int local_30;
  char local_29;
  byte local_1;
  
  __rhs = (char)((ulong)in_stack_fffffffffffffea0 >> 0x38);
  switch(in_SIL) {
  case 0x41:
  case 0x43:
  case 99:
    *in_RCX = *in_RCX + 1;
    *in_RDX = *in_RDX + 1;
    break;
  case 0x42:
    local_29 = *(char *)*in_RDX;
    *in_RCX = *in_RCX + 1;
    *in_RDX = *in_RDX + 1;
    local_30 = *(int *)*in_RDX;
    *in_RCX = *in_RCX + 4;
    *in_RDX = *in_RDX + 4;
    local_34 = 0;
    if (local_29 != 'C') {
      if (local_29 == 'I') {
LAB_0018cdf7:
        local_30 = local_30 << 2;
      }
      else {
        if (local_29 != 'S') {
          if (local_29 == 'c') goto LAB_0018cf91;
          if ((local_29 == 'f') || (local_29 == 'i')) goto LAB_0018cdf7;
          if (local_29 != 's') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_78,"invalid binary array type: ",&local_79);
            std::operator+(in_stack_fffffffffffffea8,__rhs);
            std::__cxx11::string::~string(local_78);
            std::allocator<char>::~allocator((allocator<char> *)&local_79);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b0,"BamAlignment::SkipToNextTag",&local_b1);
            SetErrorString(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                           in_stack_ffffffffffffff00);
            std::__cxx11::string::~string(local_b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_b1);
            local_1 = 0;
            std::__cxx11::string::~string(local_58);
            goto LAB_0018d11e;
          }
        }
        local_30 = local_30 << 1;
      }
    }
LAB_0018cf91:
    local_34 = local_30;
    *in_RCX = local_34 + *in_RCX;
    *in_RDX = *in_RDX + (long)local_34;
    break;
  default:
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff07;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff08,"invalid tag type: ",(allocator *)__lhs);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"BamAlignment::SkipToNextTag",&local_121);
    SetErrorString(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    local_1 = 0;
    std::__cxx11::string::~string(local_d8);
    goto LAB_0018d11e;
  case 0x48:
  case 0x5a:
    while (*(char *)*in_RDX != '\0') {
      *in_RCX = *in_RCX + 1;
      *in_RDX = *in_RDX + 1;
    }
    *in_RCX = *in_RCX + 1;
    *in_RDX = *in_RDX + 1;
    break;
  case 0x49:
  case 0x66:
  case 0x69:
    *in_RCX = *in_RCX + 4;
    *in_RDX = *in_RDX + 4;
    break;
  case 0x53:
  case 0x73:
    *in_RCX = *in_RCX + 2;
    *in_RDX = *in_RDX + 2;
  }
  local_1 = 1;
LAB_0018d11e:
  return (bool)(local_1 & 1);
}

Assistant:

bool BamAlignment::SkipToNextTag(const char storageType,
                                 char*& pTagData,
                                 unsigned int& numBytesParsed) const
{
    switch (storageType) {

        case (Constants::BAM_TAG_TYPE_ASCII) :
        case (Constants::BAM_TAG_TYPE_INT8)  :
        case (Constants::BAM_TAG_TYPE_UINT8) :
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_INT16)  :
        case (Constants::BAM_TAG_TYPE_UINT16) :
            numBytesParsed += sizeof(uint16_t);
            pTagData       += sizeof(uint16_t);
            break;

        case (Constants::BAM_TAG_TYPE_FLOAT)  :
        case (Constants::BAM_TAG_TYPE_INT32)  :
        case (Constants::BAM_TAG_TYPE_UINT32) :
            numBytesParsed += sizeof(uint32_t);
            pTagData       += sizeof(uint32_t);
            break;

        case (Constants::BAM_TAG_TYPE_STRING) :
        case (Constants::BAM_TAG_TYPE_HEX)    :
            while( *pTagData ) {
                ++numBytesParsed;
                ++pTagData;
            }
            // increment for null-terminator
            ++numBytesParsed;
            ++pTagData;
            break;

        case (Constants::BAM_TAG_TYPE_ARRAY) :

        {
            // read array type
            const char arrayType = *pTagData;
            ++numBytesParsed;
            ++pTagData;

            // read number of elements
            int32_t numElements;
            memcpy(&numElements, pTagData, sizeof(uint32_t)); // already endian-swapped, if needed
            numBytesParsed += sizeof(uint32_t);
            pTagData       += sizeof(uint32_t);

            // calculate number of bytes to skip
            int bytesToSkip = 0;
            switch (arrayType) {
                case (Constants::BAM_TAG_TYPE_INT8)  :
                case (Constants::BAM_TAG_TYPE_UINT8) :
                    bytesToSkip = numElements;
                    break;
                case (Constants::BAM_TAG_TYPE_INT16)  :
                case (Constants::BAM_TAG_TYPE_UINT16) :
                    bytesToSkip = numElements*sizeof(uint16_t);
                    break;
                case (Constants::BAM_TAG_TYPE_FLOAT)  :
                case (Constants::BAM_TAG_TYPE_INT32)  :
                case (Constants::BAM_TAG_TYPE_UINT32) :
                    bytesToSkip = numElements*sizeof(uint32_t);
                    break;
                default:
                    const string message = string("invalid binary array type: ") + arrayType;
                    SetErrorString("BamAlignment::SkipToNextTag", message);
                    return false;
            }

            // skip binary array contents
            numBytesParsed += bytesToSkip;
            pTagData       += bytesToSkip;
            break;
        }

        default:
            const string message = string("invalid tag type: ") + storageType;
            SetErrorString("BamAlignment::SkipToNextTag", message);
            return false;
    }

    // if we get here, tag skipped OK - return success
    return true;
}